

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NMEADevice.h
# Opt level: O3

int ConnectNMEADevice(NMEADEVICE *pNMEADevice,char *szCfgFilePath)

{
  int iVar1;
  FILE *__stream;
  char *pcVar2;
  char line [256];
  byte local_138;
  char local_137;
  
  memset(pNMEADevice->szCfgFilePath,0,0x100);
  sprintf(pNMEADevice->szCfgFilePath,"%.255s",szCfgFilePath);
  iVar1 = strncmp(szCfgFilePath,"hardcoded://",0xc);
  if (iVar1 != 0) {
    memset(&local_138,0,0x100);
    memset(pNMEADevice->szDevPath + 5,0,0xfb);
    builtin_strncpy(pNMEADevice->szDevPath,"COM1",5);
    pNMEADevice->BaudRate = 0x12c0;
    pNMEADevice->timeout = 1000;
    pNMEADevice->threadperiod = 100;
    pNMEADevice->bSaveRawData = 1;
    pNMEADevice->bEnableGPGGA = 1;
    pNMEADevice->bEnableGPRMC = 0;
    pNMEADevice->bEnableGPGLL = 0;
    pNMEADevice->bEnableGPVTG = 0;
    pNMEADevice->bEnableHCHDG = 0;
    pNMEADevice->bEnableIIMWV = 0;
    pNMEADevice->bEnableWIMWV = 0;
    pNMEADevice->bEnableWIMWD = 0;
    pNMEADevice->bEnableWIMDA = 0;
    pNMEADevice->bEnableAIVDM = 0;
    __stream = fopen(szCfgFilePath,"r");
    if (__stream == (FILE *)0x0) {
      pcVar2 = "Configuration file not found.";
    }
    else {
LAB_00162cf6:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162d2d;
          if (local_138 != 0x24) {
LAB_00162d45:
            if (pcVar2 != (char *)0x0) goto LAB_00162d56;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162d45;
          goto LAB_00162cf6;
        }
LAB_00162d2d:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162d56:
      iVar1 = __isoc99_sscanf(&local_138,"%255s",pNMEADevice->szDevPath);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00162d82:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162db9;
          if (local_138 != 0x24) {
LAB_00162dc5:
            if (pcVar2 != (char *)0x0) goto LAB_00162dd6;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162dc5;
          goto LAB_00162d82;
        }
LAB_00162db9:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162dd6:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->BaudRate);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00162e02:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162e39;
          if (local_138 != 0x24) {
LAB_00162e45:
            if (pcVar2 != (char *)0x0) goto LAB_00162e56;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162e45;
          goto LAB_00162e02;
        }
LAB_00162e39:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162e56:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->timeout);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00162e82:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162eb9;
          if (local_138 != 0x24) {
LAB_00162ec5:
            if (pcVar2 != (char *)0x0) goto LAB_00162ed6;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162ec5;
          goto LAB_00162e82;
        }
LAB_00162eb9:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162ed6:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->threadperiod);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00162f04:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162f3b;
          if (local_138 != 0x24) {
LAB_00162f47:
            if (pcVar2 != (char *)0x0) goto LAB_00162f58;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162f47;
          goto LAB_00162f04;
        }
LAB_00162f3b:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162f58:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bSaveRawData);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00162f86:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00162fbd;
          if (local_138 != 0x24) {
LAB_00162fc9:
            if (pcVar2 != (char *)0x0) goto LAB_00162fda;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00162fc9;
          goto LAB_00162f86;
        }
LAB_00162fbd:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00162fda:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableGPGGA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163008:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_0016303f;
          if (local_138 != 0x24) {
LAB_0016304b:
            if (pcVar2 != (char *)0x0) goto LAB_0016305c;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0016304b;
          goto LAB_00163008;
        }
LAB_0016303f:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_0016305c:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableGPRMC);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_0016308a:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001630c1;
          if (local_138 != 0x24) {
LAB_001630cd:
            if (pcVar2 != (char *)0x0) goto LAB_001630de;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001630cd;
          goto LAB_0016308a;
        }
LAB_001630c1:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001630de:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableGPGLL);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_0016310c:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00163143;
          if (local_138 != 0x24) {
LAB_0016314f:
            if (pcVar2 != (char *)0x0) goto LAB_00163160;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0016314f;
          goto LAB_0016310c;
        }
LAB_00163143:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00163160:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableGPVTG);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_0016318e:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001631c5;
          if (local_138 != 0x24) {
LAB_001631d1:
            if (pcVar2 != (char *)0x0) goto LAB_001631e2;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001631d1;
          goto LAB_0016318e;
        }
LAB_001631c5:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001631e2:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableHCHDG);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163210:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_00163247;
          if (local_138 != 0x24) {
LAB_00163253:
            if (pcVar2 != (char *)0x0) goto LAB_00163264;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00163253;
          goto LAB_00163210;
        }
LAB_00163247:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00163264:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableIIMWV);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163292:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001632c9;
          if (local_138 != 0x24) {
LAB_001632d5:
            if (pcVar2 != (char *)0x0) goto LAB_001632e6;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001632d5;
          goto LAB_00163292;
        }
LAB_001632c9:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001632e6:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableWIMWV);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163314:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_0016334b;
          if (local_138 != 0x24) {
LAB_00163357:
            if (pcVar2 != (char *)0x0) goto LAB_00163368;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_00163357;
          goto LAB_00163314;
        }
LAB_0016334b:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_00163368:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableWIMWD);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163396:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_001633cd;
          if (local_138 != 0x24) {
LAB_001633d9:
            if (pcVar2 != (char *)0x0) goto LAB_001633ea;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_001633d9;
          goto LAB_00163396;
        }
LAB_001633cd:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_001633ea:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableWIMDA);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
LAB_00163418:
      do {
        pcVar2 = fgets((char *)&local_138,0x100,__stream);
        if (local_138 < 0x25) {
          if (local_138 == 0x23) goto LAB_0016344f;
          if (local_138 != 0x24) {
LAB_0016345b:
            if (pcVar2 != (char *)0x0) goto LAB_0016346c;
          }
          break;
        }
        if (local_138 != 0x25) {
          if (((local_138 != 0x2f) || (pcVar2 == (char *)0x0)) || (local_137 != '/'))
          goto LAB_0016345b;
          goto LAB_00163418;
        }
LAB_0016344f:
      } while (pcVar2 != (char *)0x0);
      puts("Invalid configuration file.");
LAB_0016346c:
      iVar1 = __isoc99_sscanf(&local_138,"%d",&pNMEADevice->bEnableAIVDM);
      if (iVar1 != 1) {
        puts("Invalid configuration file.");
      }
      iVar1 = fclose(__stream);
      if (iVar1 == 0) goto LAB_001634ad;
      pcVar2 = "fclose() failed.";
    }
    puts(pcVar2);
  }
LAB_001634ad:
  if (pNMEADevice->threadperiod < 0) {
    puts("Invalid parameter : threadperiod.");
    pNMEADevice->threadperiod = 100;
  }
  memset(&pNMEADevice->LastNMEAData,0,0x3d8);
  iVar1 = OpenRS232Port(&pNMEADevice->RS232Port,pNMEADevice->szDevPath);
  if (iVar1 == 0) {
    iVar1 = (pNMEADevice->RS232Port).DevType;
    if (3 < iVar1 - 1U) {
      if ((iVar1 != 0) ||
         (iVar1 = SetOptionsComputerRS232Port
                            ((pNMEADevice->RS232Port).hDev,pNMEADevice->BaudRate,'\0',0,'\b','\0',
                             pNMEADevice->timeout), iVar1 != 0)) {
        puts("Unable to connect to a NMEADevice.");
        CloseRS232Port(&pNMEADevice->RS232Port);
        goto LAB_001634fe;
      }
      tcflush(*(int *)&(pNMEADevice->RS232Port).hDev,2);
    }
    puts("NMEADevice connected.");
    iVar1 = 0;
  }
  else {
    puts("Unable to connect to a NMEADevice.");
LAB_001634fe:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

inline int ConnectNMEADevice(NMEADEVICE* pNMEADevice, char* szCfgFilePath)
{
	FILE* file = NULL;
	char line[256];

	memset(pNMEADevice->szCfgFilePath, 0, sizeof(pNMEADevice->szCfgFilePath));
	sprintf(pNMEADevice->szCfgFilePath, "%.255s", szCfgFilePath);

	// If szCfgFilePath starts with "hardcoded://", parameters are assumed to be already set in the structure, 
	// otherwise it should be loaded from a configuration file.
	if (strncmp(szCfgFilePath, "hardcoded://", strlen("hardcoded://")) != 0)
	{
		memset(line, 0, sizeof(line));

		// Default values.
		memset(pNMEADevice->szDevPath, 0, sizeof(pNMEADevice->szDevPath));
		sprintf(pNMEADevice->szDevPath, "COM1");
		pNMEADevice->BaudRate = 4800;
		pNMEADevice->timeout = 1000;
		pNMEADevice->threadperiod = 100;
		pNMEADevice->bSaveRawData = 1;
		pNMEADevice->bEnableGPGGA = 1;
		pNMEADevice->bEnableGPRMC = 0;
		pNMEADevice->bEnableGPGLL = 0;
		pNMEADevice->bEnableGPVTG = 0;
		pNMEADevice->bEnableHCHDG = 0;
		pNMEADevice->bEnableIIMWV = 0;
		pNMEADevice->bEnableWIMWV = 0;
		pNMEADevice->bEnableWIMWD = 0;
		pNMEADevice->bEnableWIMDA = 0;
		pNMEADevice->bEnableAIVDM = 0;

		// Load data from a file.
		file = fopen(szCfgFilePath, "r");
		if (file != NULL)
		{
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%255s", pNMEADevice->szDevPath) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->BaudRate) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->timeout) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->threadperiod) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bSaveRawData) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPGGA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPRMC) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPGLL) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableGPVTG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableHCHDG) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableIIMWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMWV) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMWD) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableWIMDA) != 1) printf("Invalid configuration file.\n");
			if (fgets3(file, line, sizeof(line)) == NULL) printf("Invalid configuration file.\n");
			if (sscanf(line, "%d", &pNMEADevice->bEnableAIVDM) != 1) printf("Invalid configuration file.\n");
			if (fclose(file) != EXIT_SUCCESS) printf("fclose() failed.\n");
		}
		else
		{
			printf("Configuration file not found.\n");
		}
	}

	if (pNMEADevice->threadperiod < 0)
	{
		printf("Invalid parameter : threadperiod.\n");
		pNMEADevice->threadperiod = 100;
	}

	// Used to save raw data, should be handled specifically...
	//pNMEADevice->pfSaveFile = NULL;

	memset(&pNMEADevice->LastNMEAData, 0, sizeof(NMEADATA));

	if (OpenRS232Port(&pNMEADevice->RS232Port, pNMEADevice->szDevPath) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEADevice.\n");
		return EXIT_FAILURE;
	}

	if (SetOptionsRS232Port(&pNMEADevice->RS232Port, pNMEADevice->BaudRate, NOPARITY, FALSE, 8, 
		ONESTOPBIT, (UINT)pNMEADevice->timeout) != EXIT_SUCCESS)
	{
		printf("Unable to connect to a NMEADevice.\n");
		CloseRS232Port(&pNMEADevice->RS232Port);
		return EXIT_FAILURE;
	}

	printf("NMEADevice connected.\n");

	return EXIT_SUCCESS;
}